

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_fp8_to_fp16
          (Impl *this,SPIRVModule *module,Id *ids,uint32_t id_count)

{
  Builder *this_00;
  Id returnType;
  undefined8 uVar1;
  Block *elseBlock;
  Impl *pIVar2;
  Id typeId;
  Id typeId_00;
  Id id;
  pointer pCVar3;
  Function *parent;
  Block *pBVar4;
  Instruction *pIVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Instruction *this_01;
  Id IVar8;
  Id local_ac;
  Block *entry;
  Instruction *local_a0;
  Block *local_98;
  Block *local_90;
  Impl *local_88;
  Instruction *local_80;
  Block *local_78;
  Vector<CoopMatConvOp> *local_70;
  CoopMatConvOp local_68;
  undefined8 local_58;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  IVar8 = 0;
  if (id_count == 2) {
    IVar8 = *ids;
    returnType = ids[1];
    uVar1._0_4_ = ids[0];
    uVar1._4_4_ = ids[1];
    local_70 = &this->coop_mat_conv_ids;
    for (pCVar3 = (this->coop_mat_conv_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar3 != (this->coop_mat_conv_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
      if (((pCVar3->input_type == IVar8) && (pCVar3->output_type == returnType)) &&
         (pCVar3->call == CoopMatFP8toFP16)) {
        return pCVar3->func_id;
      }
    }
    this_00 = &this->builder;
    local_78 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    typeId = spv::Builder::makeUintType(this_00,0x20);
    typeId_00 = spv::Builder::makeBoolType(this_00);
    local_ac = spv::Builder::makePointer(this_00,StorageClassFunction,IVar8);
    local_68.input_type = 0;
    local_68.output_type = 0;
    local_68.func_id = 0;
    local_68.call = DescriptorQACheck;
    local_58 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_68,
               &local_ac);
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parent = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,returnType,"CoopMatFP8toFP16",(Vector<Id> *)&local_68,
                        &local_48,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_68);
    id = create_variable(this,StorageClassFunction,returnType,"coop_output");
    local_80 = spv::Builder::addInstruction(this_00,typeId,OpCooperativeMatrixLengthKHR);
    spv::Instruction::addIdOperand(local_80,IVar8);
    pBVar4 = (Block *)allocate_in_thread(0x78);
    IVar8 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar8;
    spv::Block::Block(pBVar4,IVar8,parent);
    local_90 = (Block *)allocate_in_thread(0x78);
    IVar8 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar8;
    local_88 = this;
    spv::Block::Block(local_90,IVar8,parent);
    spv::Builder::createBranch(this_00,pBVar4);
    (this->builder).buildPoint = pBVar4;
    local_98 = pBVar4;
    pIVar5 = spv::Builder::addInstruction(this_00,typeId,OpPhi);
    pIVar6 = spv::Builder::addInstruction(this_00,typeId,OpIAdd);
    spv::Instruction::addIdOperand(pIVar6,pIVar5->resultId);
    IVar8 = spv::Builder::makeUintConstant(this_00,1,false);
    spv::Instruction::addIdOperand(pIVar6,IVar8);
    IVar8 = spv::Builder::makeUintConstant(this_00,0,false);
    spv::Instruction::addIdOperand(pIVar5,IVar8);
    spv::Instruction::addIdOperand
              (pIVar5,*(Id *)((long)(((entry->instructions).
                                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                    ._M_t + 8));
    spv::Instruction::addIdOperand(pIVar5,pIVar6->resultId);
    local_a0 = pIVar5;
    spv::Instruction::addIdOperand
              (pIVar5,*(Id *)((long)(((pBVar4->instructions).
                                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                    ._M_t + 8));
    IVar8 = spv::Builder::makeUintType(this_00,8);
    IVar8 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar8);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar8,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand
              (pIVar7,(*(parent->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->resultId);
    spv::Instruction::addIdOperand(pIVar7,pIVar5->resultId);
    IVar8 = spv::Builder::makeUintType(this_00,8);
    pIVar5 = spv::Builder::addInstruction(this_00,IVar8,OpLoad);
    spv::Instruction::addIdOperand(pIVar5,pIVar7->resultId);
    IVar8 = spv::Builder::makeIntType(this_00,0x10);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar8,OpSConvert);
    spv::Instruction::addIdOperand(pIVar7,pIVar5->resultId);
    IVar8 = spv::Builder::makeIntType(this_00,0x10);
    pIVar5 = spv::Builder::addInstruction(this_00,IVar8,OpShiftLeftLogical);
    spv::Instruction::addIdOperand(pIVar5,pIVar7->resultId);
    IVar8 = spv::Builder::makeInt16Constant(this_00,7,false);
    spv::Instruction::addIdOperand(pIVar5,IVar8);
    IVar8 = spv::Builder::makeIntType(this_00,0x10);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar8,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar7,pIVar5->resultId);
    IVar8 = spv::Builder::makeInt16Constant(this_00,-0x4001,false);
    spv::Instruction::addIdOperand(pIVar7,IVar8);
    IVar8 = spv::Builder::makeFloatType(this_00,0x10);
    pIVar5 = spv::Builder::addInstruction(this_00,IVar8,OpBitcast);
    spv::Instruction::addIdOperand(pIVar5,pIVar7->resultId);
    IVar8 = spv::Builder::makeFloatType(this_00,0x10);
    IVar8 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar8);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar8,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand(pIVar7,id);
    spv::Instruction::addIdOperand(pIVar7,local_a0->resultId);
    this_01 = spv::Builder::addInstruction(this_00,OpStore);
    spv::Instruction::addIdOperand(this_01,pIVar7->resultId);
    spv::Instruction::addIdOperand(this_01,pIVar5->resultId);
    pIVar5 = spv::Builder::addInstruction(this_00,typeId_00,OpULessThan);
    spv::Instruction::addIdOperand(pIVar5,pIVar6->resultId);
    spv::Instruction::addIdOperand(pIVar5,local_80->resultId);
    elseBlock = local_90;
    pBVar4 = local_98;
    spv::Builder::createLoopMerge(this_00,local_90,local_98,0);
    spv::Builder::createConditionalBranch(this_00,pIVar5->resultId,pBVar4,elseBlock);
    pIVar2 = local_88;
    (local_88->builder).buildPoint = elseBlock;
    pIVar5 = spv::Builder::addInstruction(this_00,returnType,OpLoad);
    spv::Instruction::addIdOperand(pIVar5,id);
    pIVar6 = spv::Builder::addInstruction(this_00,returnType,OpMatrixTimesScalar);
    spv::Instruction::addIdOperand(pIVar6,pIVar5->resultId);
    IVar8 = spv::Builder::makeFloat16Constant(this_00,0x5c00,false);
    spv::Instruction::addIdOperand(pIVar6,IVar8);
    spv::Builder::makeReturn(this_00,false,pIVar6->resultId);
    (pIVar2->builder).buildPoint = local_78;
    local_68.call = CoopMatFP8toFP16;
    local_68.func_id = (parent->functionInstruction).resultId;
    local_68._0_8_ = uVar1;
    std::
    vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
    ::emplace_back<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>(local_70,&local_68);
    IVar8 = (parent->functionInstruction).resultId;
  }
  return IVar8;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_fp8_to_fp16(SPIRVModule &module, const spv::Id *ids, uint32_t id_count)
{
	if (id_count != 2)
		return 0;

	spv::Id u8_type = ids[0];
	spv::Id f16_type = ids[1];

	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == u8_type && ops.output_type == f16_type && ops.call == HelperCall::CoopMatFP8toFP16)
			return ops.func_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id u8_ptr_type = builder.makePointer(spv::StorageClassFunction, u8_type);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, f16_type,
	                                       "CoopMatFP8toFP16",
	                                       { u8_ptr_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, f16_type, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(u8_type);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeUintType(8)), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(builder.makeUintType(8), spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *sext = builder.addInstruction(builder.makeIntType(16), spv::OpSConvert);
		sext->addIdOperand(load->getResultId());

		auto *shift = builder.addInstruction(builder.makeIntType(16), spv::OpShiftLeftLogical);
		shift->addIdOperand(sext->getResultId());
		shift->addIdOperand(builder.makeInt16Constant(7));

		auto *mask = builder.addInstruction(builder.makeIntType(16), spv::OpBitwiseAnd);
		mask->addIdOperand(shift->getResultId());
		mask->addIdOperand(builder.makeInt16Constant(int16_t(0xffff ^ 0x4000)));

		auto *bitcast = builder.addInstruction(builder.makeFloatType(16), spv::OpBitcast);
		bitcast->addIdOperand(mask->getResultId());

		auto *output_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeFloatType(16)), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());
		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(bitcast->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(f16_type, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	// Need post-scale to correctly deal with denorms.
	auto *scale = builder.addInstruction(f16_type, spv::OpMatrixTimesScalar);
	scale->addIdOperand(loaded_result->getResultId());
	scale->addIdOperand(builder.makeFloat16Constant(0x5c00 /* 256.0 */));

	builder.makeReturn(false, scale->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ u8_type, f16_type, func->getId(), HelperCall::CoopMatFP8toFP16 });
	return func->getId();
}